

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,void *dirtyPage,HeapBlockType blockType,L2MapChunk *chunk,uint id2,
          bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  byte bVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 *puVar5;
  BVStatic<256UL> *heapBlockMarkBits;
  ulong uVar6;
  
  if (chunk == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2c8,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar4) goto LAB_006c0cae;
    *puVar5 = 0;
  }
  heapBlockMarkBits =
       BVStatic<65536ul>::GetRange<256ul>
                 ((BVStatic<65536ul> *)chunk,(uint)((ulong)dirtyPage >> 4) & 0xff00);
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      if (uVar6 == 3) break;
      uVar3 = uVar6 + 1;
    } while (heapBlockMarkBits->data[uVar6 + 1].word == 0);
    if (2 < uVar6) {
      return false;
    }
  }
  if (chunk->map[id2]->heapBlockType != blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2d2,"(chunk->map[id2]->GetHeapBlockType() == blockType)",
                       "chunk->map[id2]->GetHeapBlockType() == blockType");
    if (!bVar4) {
LAB_006c0cae:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar1 = chunk->blockInfo[id2].bucketIndex;
  bVar4 = SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
          ::RescanObjectsOnPage
                    ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,(char *)dirtyPage,
                     (char *)((ulong)dirtyPage & 0xfffffffffffff000),heapBlockMarkBits,
                     (uint)bVar1 * 0x10 + 0x10,(uint)bVar1,anyObjectsMarkedOnPage,recycler);
  if (!bVar4) {
    HeapBlock::SetNeedOOMRescan(chunk->map[id2],recycler);
  }
  return bVar4;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlock(void * dirtyPage, HeapBlock::HeapBlockType blockType, L2MapChunk* chunk, uint id2, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    Assert(chunk != nullptr);
    char* heapBlockPageAddress = TBlockType::GetBlockStartAddress((char*) dirtyPage);

    typedef typename TBlockType::HeapBlockAttributes TBlockAttributes;

    // We need to check the entire mark bit vector here. It's not sufficient to just check the page's
    // mark bit vector because the object that's dirty on the page could have started on an earlier page
    auto markBits = chunk->GetMarkBitVectorForPages<TBlockAttributes::BitVectorCount>(heapBlockPageAddress);
    if (!markBits->IsAllClear())
    {
        Assert(chunk->map[id2]->GetHeapBlockType() == blockType);

        // Small finalizable heap blocks require the HeapBlock * (to look up object attributes).
        // For others, this is null
        TBlockType* block = GetHeapBlockForRescan<TBlockType>(chunk, id2);
        uint bucketIndex = chunk->blockInfo[id2].bucketIndex;
        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(block,
            (char *)dirtyPage, heapBlockPageAddress, markBits, HeapInfo::GetObjectSizeForBucketIndex<TBlockAttributes>(bucketIndex), bucketIndex, anyObjectsMarkedOnPage, recycler))
        {
            // Failed due to OOM
            ((TBlockType*) chunk->map[id2])->SetNeedOOMRescan(recycler);
            return false;
        }

        return true;
    }

    // Didn't actually rescan the block.
    return false;
}